

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_bool nk_input_is_mouse_pressed(nk_input *i,nk_buttons id)

{
  nk_bool nVar1;
  
  nVar1 = 0;
  if ((i != (nk_input *)0x0) &&
     (((i->mouse).buttons[id].down == 0 || (nVar1 = 1, (i->mouse).buttons[id].clicked == 0)))) {
    return 0;
  }
  return nVar1;
}

Assistant:

NK_API nk_bool
nk_input_is_mouse_pressed(const struct nk_input *i, enum nk_buttons id)
{
const struct nk_mouse_button *b;
if (!i) return nk_false;
b = &i->mouse.buttons[id];
if (b->down && b->clicked)
return nk_true;
return nk_false;
}